

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createLoad(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  Type *Ty;
  RWNode *pRVar1;
  DataLayout *DL;
  Offset size;
  Use *pUVar2;
  GenericDefSite<dg::dda::RWNode> *ds;
  pointer __v;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  defSites;
  
  pRVar1 = ReadWriteGraph::create(&this->graph,LOAD);
  Ty = *(Type **)Inst;
  DL = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getDataLayout
                 (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>
                 );
  size.offset = llvmutils::getAllocatedSize(Ty,DL);
  if (size.offset == 0) {
    size.offset = Offset::UNKNOWN;
  }
  pUVar2 = llvm::User::getOperandList((User *)Inst);
  mapPointers(&defSites,this,(Value *)Inst,*(Value **)pUVar2,size);
  for (__v = defSites.
             super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __v != defSites.
             super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __v = __v + 1) {
    std::
    _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
    ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
              ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)&(pRVar1->annotations).uses,__v);
  }
  std::
  _Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::~_Vector_base(&defSites.
                   super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                 );
  return pRVar1;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createLoad(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::LOAD);

    uint64_t size =
            llvmutils::getAllocatedSize(Inst->getType(), getDataLayout());
    if (size == 0)
        size = Offset::UNKNOWN;

    auto defSites = mapPointers(Inst, Inst->getOperand(0), size);
    for (const auto &ds : defSites) {
        node.addUse(ds);
    }

    return &node;
}